

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyPureVector.cpp
# Opt level: O0

void __thiscall PolicyPureVector::PolicyPureVector(PolicyPureVector *this,PolicyPureVector *o)

{
  long in_RSI;
  PolicyDiscretePure *in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000008;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000010;
  PolicyDiscretePure *in_stack_ffffffffffffffb8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffc8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffd0;
  
  PolicyDiscretePure::PolicyDiscretePure(in_RDI,in_stack_ffffffffffffffb8);
  (in_RDI->super_PolicyDiscrete).super_Policy._vptr_Policy =
       (_func_int **)&PTR__PolicyPureVector_00d142f0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x984192);
  *(undefined4 *)&(in_RDI->super_PolicyDiscrete).field_0x34 = *(undefined4 *)(in_RSI + 0x34);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_00000010,in_stack_00000008);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

PolicyPureVector::PolicyPureVector(const PolicyPureVector& o) :
    PolicyDiscretePure(o)
{
    if(DEBUG_PPV)    cout << " clone PolicyPureVector ";
    _m_agentI = o._m_agentI;
    _m_domainToActionIndices =vector<Index>(o._m_domainToActionIndices);
}